

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitAig.c
# Opt level: O3

Aig_Obj_t * Kit_GraphToAigInternal(Aig_Man_t *pMan,Kit_Graph_t *pGraph)

{
  Kit_Edge_t KVar1;
  uint uVar2;
  Kit_Node_t *pKVar3;
  Aig_Obj_t *pAVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  
  KVar1 = pGraph->eRoot;
  if (pGraph->fConst == 0) {
    uVar7 = (ulong)(uint)pGraph->nLeaves;
    uVar5 = (uint)KVar1 >> 1 & 0x3fffffff;
    if (uVar5 < (uint)pGraph->nLeaves) {
      pAVar4 = (Aig_Obj_t *)((ulong)((uint)KVar1 & 1) ^ (ulong)pGraph->pNodes[uVar5].field_2.pFunc);
    }
    else {
      lVar6 = uVar7 * 0x18 + 8;
      do {
        pKVar3 = pGraph->pNodes;
        uVar5 = *(uint *)((long)pKVar3 + lVar6 + -8);
        uVar2 = *(uint *)((long)pKVar3 + lVar6 + -4);
        pAVar4 = Aig_And(pMan,(Aig_Obj_t *)
                              ((ulong)(uVar5 & 1) ^
                              (ulong)pKVar3[uVar5 >> 1 & 0x3fffffff].field_2.pFunc),
                         (Aig_Obj_t *)
                         ((ulong)(uVar2 & 1) ^ (ulong)pKVar3[uVar2 >> 1 & 0x3fffffff].field_2.pFunc)
                        );
        *(Aig_Obj_t **)(&(pKVar3->eEdge0).field_0x0 + lVar6) = pAVar4;
        uVar7 = uVar7 + 1;
        lVar6 = lVar6 + 0x18;
      } while ((long)uVar7 < (long)pGraph->nSize);
      pAVar4 = (Aig_Obj_t *)((ulong)((uint)pGraph->eRoot & 1) ^ (ulong)pAVar4);
    }
  }
  else {
    pAVar4 = (Aig_Obj_t *)((ulong)((uint)KVar1 & 1) ^ (ulong)pMan->pConst1);
  }
  return pAVar4;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Transforms the decomposition graph into the AIG.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Aig_Obj_t * Kit_GraphToAigInternal( Aig_Man_t * pMan, Kit_Graph_t * pGraph )
{
    Kit_Node_t * pNode = NULL;
    Aig_Obj_t * pAnd0, * pAnd1;
    int i;
    // check for constant function
    if ( Kit_GraphIsConst(pGraph) )
        return Aig_NotCond( Aig_ManConst1(pMan), Kit_GraphIsComplement(pGraph) );
    // check for a literal
    if ( Kit_GraphIsVar(pGraph) )
        return Aig_NotCond( (Aig_Obj_t *)Kit_GraphVar(pGraph)->pFunc, Kit_GraphIsComplement(pGraph) );
    // build the AIG nodes corresponding to the AND gates of the graph
    Kit_GraphForEachNode( pGraph, pNode, i )
    {
        pAnd0 = Aig_NotCond( (Aig_Obj_t *)Kit_GraphNode(pGraph, pNode->eEdge0.Node)->pFunc, pNode->eEdge0.fCompl ); 
        pAnd1 = Aig_NotCond( (Aig_Obj_t *)Kit_GraphNode(pGraph, pNode->eEdge1.Node)->pFunc, pNode->eEdge1.fCompl ); 
        pNode->pFunc = Aig_And( pMan, pAnd0, pAnd1 );
    }
    // complement the result if necessary
    return Aig_NotCond( (Aig_Obj_t *)pNode->pFunc, Kit_GraphIsComplement(pGraph) );
}